

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O0

void __thiscall glTF::Node::Node(Node *this)

{
  Node *this_local;
  
  glTF::Object::Object(&this->super_Object);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_IsSpecial_00f3de18;
  std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::vector
            (&this->children);
  std::vector<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>::vector(&this->meshes)
  ;
  Nullable<float[16]>::Nullable(&this->matrix);
  Nullable<float[3]>::Nullable(&this->translation);
  Nullable<float[4]>::Nullable(&this->rotation);
  Nullable<float[3]>::Nullable(&this->scale);
  Ref<glTF::Camera>::Ref(&this->camera);
  Ref<glTF::Light>::Ref(&this->light);
  std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::vector
            (&this->skeletons);
  Ref<glTF::Skin>::Ref(&this->skin);
  std::__cxx11::string::string((string *)&this->jointName);
  Ref<glTF::Node>::Ref(&this->parent);
  return;
}

Assistant:

Node() {}